

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall common_log::add(common_log *this,ggml_log_level level,char *fmt,__va_list_tag *args)

{
  char *pcVar1;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pcVar6;
  pointer pcVar7;
  long lVar8;
  size_t i;
  size_t sVar9;
  allocator_type local_4d;
  ggml_log_level local_4c;
  va_list args_copy;
  
  std::mutex::lock(&this->mtx);
  if (this->running == true) {
    pcVar6 = (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = this->tail;
    pcVar7 = pcVar6 + sVar9;
    args_copy[0].reg_save_area = args->reg_save_area;
    args_copy[0].gp_offset = args->gp_offset;
    args_copy[0].fp_offset = args->fp_offset;
    args_copy[0].overflow_arg_area = args->overflow_arg_area;
    pcVar1 = pcVar6[sVar9].msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_4c = level;
    iVar2 = vsnprintf(pcVar1,(long)*(pointer *)
                                    ((long)&pcVar6[sVar9].msg.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    + 8) - (long)pcVar1,fmt,args);
    if ((ulong)((long)*(pointer *)
                       ((long)&pcVar6[sVar9].msg.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl + 8) -
               *(long *)&pcVar6[sVar9].msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data) <= (ulong)(long)iVar2) {
      std::vector<char,_std::allocator<char>_>::resize(&pcVar6[sVar9].msg,(long)iVar2 + 1);
      pcVar1 = (pcVar7->msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      vsnprintf(pcVar1,(long)*(pointer *)
                              ((long)&(pcVar7->msg).super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl + 8) - (long)pcVar1,fmt,args_copy);
    }
    pcVar7->level = local_4c;
    pcVar7->prefix = this->prefix;
    pcVar7->timestamp = 0;
    if (this->timestamps == true) {
      iVar3 = t_us();
      pcVar7->timestamp = iVar3 - this->t_start;
    }
    pcVar7->is_end = false;
    uVar4 = ((long)(this->entries).
                   super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->entries).
                  super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x30;
    uVar5 = (this->tail + 1) % uVar4;
    this->tail = uVar5;
    if (uVar5 == this->head) {
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::vector
                ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)args_copy,uVar4 * 2,
                 &local_4d);
      pcVar6 = (this->entries).
               super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = this->head;
      lVar8 = 0x10;
      sVar9 = 0;
      do {
        common_log_entry::operator=
                  ((common_log_entry *)(args_copy[0]._0_8_ + lVar8 + -0x10),pcVar6 + uVar4);
        pcVar6 = (this->entries).
                 super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (this->head + 1) %
                (ulong)(((long)(this->entries).
                               super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar6) / 0x30);
        this->head = uVar4;
        sVar9 = sVar9 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar4 != this->tail);
      this->head = 0;
      this->tail = sVar9;
      while( true ) {
        if ((ulong)(((long)args_copy[0].overflow_arg_area - args_copy[0]._0_8_) / 0x30) <= sVar9)
        break;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)(args_copy[0]._0_8_ + lVar8),0x100);
        sVar9 = sVar9 + 1;
        lVar8 = lVar8 + 0x30;
      }
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::_M_move_assign
                (&this->entries,args_copy,
                 ((long)args_copy[0].overflow_arg_area - args_copy[0]._0_8_) % 0x30);
      std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector
                ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)args_copy);
    }
    std::condition_variable::notify_one();
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void add(enum ggml_log_level level, const char * fmt, va_list args) {
        std::lock_guard<std::mutex> lock(mtx);

        if (!running) {
            // discard messages while the worker thread is paused
            return;
        }

        auto & entry = entries[tail];

        {
            // cannot use args twice, so make a copy in case we need to expand the buffer
            va_list args_copy;
            va_copy(args_copy, args);

#if 1
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args_copy);
            }
#else
            // hack for bolding arguments

            std::stringstream ss;
            for (int i = 0; fmt[i] != 0; i++) {
                if (fmt[i] == '%') {
                    ss << LOG_COL_BOLD;
                    while (fmt[i] != ' ' && fmt[i] != ')' && fmt[i] != ']' && fmt[i] != 0) ss << fmt[i++];
                    ss << LOG_COL_DEFAULT;
                    if (fmt[i] == 0) break;
                }
                ss << fmt[i];
            }
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args_copy);
            }
#endif
            va_end(args_copy);
        }

        entry.level = level;
        entry.prefix = prefix;
        entry.timestamp = 0;
        if (timestamps) {
            entry.timestamp = t_us() - t_start;
        }
        entry.is_end = false;

        tail = (tail + 1) % entries.size();
        if (tail == head) {
            // expand the buffer
            std::vector<common_log_entry> new_entries(2*entries.size());

            size_t new_tail = 0;

            do {
                new_entries[new_tail] = std::move(entries[head]);

                head     = (head     + 1) % entries.size();
                new_tail = (new_tail + 1);
            } while (head != tail);

            head = 0;
            tail = new_tail;

            for (size_t i = tail; i < new_entries.size(); i++) {
                new_entries[i].msg.resize(256);
            }

            entries = std::move(new_entries);
        }

        cv.notify_one();
    }